

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::GetFirstNonLoopInvariantOperand
          (LoopPeelingInfo *this,Instruction *condition)

{
  IRContext *this_00;
  Loop *pLVar1;
  Instruction *this_01;
  uint32_t uVar2;
  BasicBlock *pBVar3;
  const_iterator cVar4;
  uint uVar5;
  uint uVar6;
  uint32_t local_2c;
  
  uVar6 = (condition->has_result_id_ & 1) + 1;
  if (condition->has_type_id_ == false) {
    uVar6 = (uint)condition->has_result_id_;
  }
  if (uVar6 != (int)((ulong)((long)(condition->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(condition->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
    uVar5 = 0;
    do {
      this_00 = this->context_;
      uVar2 = Instruction::GetSingleWordOperand(condition,uVar6 + uVar5);
      pBVar3 = IRContext::get_instr_block(this_00,uVar2);
      if (pBVar3 == (BasicBlock *)0x0) {
LAB_0024a176:
        uVar6 = (condition->has_result_id_ & 1) + 1;
        if (condition->has_type_id_ == false) {
          uVar6 = (uint)condition->has_result_id_;
        }
        uVar2 = Instruction::GetSingleWordOperand(condition,uVar6 + uVar5);
        return uVar2;
      }
      pLVar1 = this->loop_;
      this_01 = (pBVar3->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar2 = 0;
      if (this_01->has_result_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
      }
      local_2c = uVar2;
      cVar4 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(pLVar1->loop_basic_blocks_)._M_h,&local_2c);
      if (cVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)
      goto LAB_0024a176;
      uVar5 = uVar5 + 1;
      uVar6 = (condition->has_result_id_ & 1) + 1;
      if (condition->has_type_id_ == false) {
        uVar6 = (uint)condition->has_result_id_;
      }
    } while (uVar5 < (int)((ulong)((long)(condition->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(condition->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - uVar6);
  }
  return 0;
}

Assistant:

uint32_t LoopPeelingPass::LoopPeelingInfo::GetFirstNonLoopInvariantOperand(
    Instruction* condition) const {
  for (uint32_t i = 0; i < condition->NumInOperands(); i++) {
    BasicBlock* bb =
        context_->get_instr_block(condition->GetSingleWordInOperand(i));
    if (!bb || !loop_->IsInsideLoop(bb)) {
      return condition->GetSingleWordInOperand(i);
    }
  }

  return 0;
}